

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlogin.c
# Opt level: O3

void rlogin_size(Backend *be,int width,int height)

{
  Interactor *pIVar1;
  Seat *pSVar2;
  char b [12];
  
  *(int *)((long)&be[-5].interactor + 4) = width;
  *(int *)&be[-4].vt = height;
  pIVar1 = be[-6].interactor;
  if ((pIVar1 != (Interactor *)0x0) && (*(char *)((long)&be[-5].interactor + 2) == '\x01')) {
    pSVar2 = (*pIVar1->vt->get_seat)(pIVar1);
    *(int *)((long)&be[-5].vt + 4) = (int)pSVar2;
  }
  return;
}

Assistant:

static void rlogin_size(Backend *be, int width, int height)
{
    Rlogin *rlogin = container_of(be, Rlogin, backend);
    char b[12] = { '\xFF', '\xFF', 0x73, 0x73, 0, 0, 0, 0, 0, 0, 0, 0 };

    rlogin->term_width = width;
    rlogin->term_height = height;

    if (rlogin->s == NULL || !rlogin->cansize)
        return;

    b[6] = rlogin->term_width >> 8;
    b[7] = rlogin->term_width & 0xFF;
    b[4] = rlogin->term_height >> 8;
    b[5] = rlogin->term_height & 0xFF;
    rlogin->bufsize = sk_write(rlogin->s, b, 12);
    return;
}